

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
           *this,Column_settings *colSettings)

{
  Column_settings *local_30;
  Column_settings *colSettings_local;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  *this_local;
  
  Dummy_row_access::Dummy_row_access((Dummy_row_access *)this);
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::Column_dimension_holder(&this->super_Column_dimension_option);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,0,0);
  this->operators_ = (Field_operators *)0x0;
  local_30 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    local_30 = (Column_settings *)0x0;
  }
  this->entryPool_ = (Entry_constructor *)local_30;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list(&this->column_);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(),
      Chain_opt(),
      operators_(nullptr),
      entryPool_(colSettings == nullptr ? nullptr : &(colSettings->entryConstructor)),
      column_()
{
  if (colSettings == nullptr) return;  // to allow default constructor which gives a dummy column
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }
}